

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

int __thiscall S2Loop::CompareBoundary(S2Loop *this,S2Loop *b)

{
  bool bVar1;
  uint uVar2;
  S2Point *p;
  CompareBoundaryRelation relation;
  undefined **local_20;
  byte local_18;
  char cStack_17;
  byte bStack_16;
  undefined1 uStack_15;
  undefined4 uStack_14;
  
  if ((this->num_vertices_ != 1) || ((this->origin_inside_ & 1U) != 0)) {
    if (b->num_vertices_ != 1 || (b->origin_inside_ & 1U) != 0) {
      if (((b->num_vertices_ == 1 & b->origin_inside_) != 1) || ((b->depth_ & 1) == 0)) {
        bVar1 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
        uVar2 = 0xffffffff;
        if (((bVar1) &&
            ((this->num_vertices_ != 1 || (uVar2 = 1, (this->origin_inside_ & 1U) == 0)))) &&
           ((b->num_vertices_ != 1 || (uVar2 = 0xffffffff, (b->origin_inside_ & 1U) == 0)))) {
          local_18 = (byte)b->depth_ & 1;
          local_20 = &PTR__LoopRelation_002bc608;
          cStack_17 = '\0';
          bStack_16 = 0;
          uStack_15 = 0;
          bVar1 = HasCrossingRelation(this,b,(LoopRelation *)&local_20);
          uVar2 = 0;
          if (!bVar1) {
            if (cStack_17 != '\x01') {
              p = vertex(b,0);
              bStack_16 = Contains(this,p);
            }
            uVar2 = bStack_16 - 1 | 1;
          }
        }
        return uVar2;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
                 ,0x4a8,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 CONCAT44(uStack_14,
                          CONCAT13(uStack_15,CONCAT12(bStack_16,CONCAT11(cStack_17,local_18)))),
                 "Check failed: !b->is_full() || !b->is_hole() ",0x2d);
      goto LAB_001fd01f;
    }
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
             ,0x4a7,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             CONCAT44(uStack_14,CONCAT13(uStack_15,CONCAT12(bStack_16,CONCAT11(cStack_17,local_18)))
                     ),"Check failed: !is_empty() && !b->is_empty() ",0x2c);
LAB_001fd01f:
  abort();
}

Assistant:

int S2Loop::CompareBoundary(const S2Loop* b) const {
  S2_DCHECK(!is_empty() && !b->is_empty());
  S2_DCHECK(!b->is_full() || !b->is_hole());

  // The bounds must intersect for containment or crossing.
  if (!bound_.Intersects(b->bound_)) return -1;

  // Full loops are handled as though the loop surrounded the entire sphere.
  if (is_full()) return 1;
  if (b->is_full()) return -1;

  // Check whether there are any edge crossings, and also check the loop
  // relationship at any shared vertices.
  CompareBoundaryRelation relation(b->is_hole());
  if (HasCrossingRelation(*this, *b, &relation)) return 0;
  if (relation.found_shared_vertex()) {
    return relation.contains_edge() ? 1 : -1;
  }

  // There are no edge intersections or shared vertices, so we can check
  // whether A contains an arbitrary vertex of B.
  return Contains(b->vertex(0)) ? 1 : -1;
}